

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparse_array.hpp
# Opt level: O0

unique_ptr<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>_>
 __thiscall
pstore::sparse_array<int,unsigned_long>::make_unique<unsigned_long*,int*>
          (sparse_array<int,unsigned_long> *this,unsigned_long *first_index,
          unsigned_long *last_index,int *first_value,int *last_value)

{
  pointer __p;
  int *last_value_local;
  int *first_value_local;
  unsigned_long *last_index_local;
  unsigned_long *first_index_local;
  
  __p = (pointer)new<unsigned_long*>(0x10,first_index,last_index);
  sparse_array<unsigned_long*,int*>
            ((sparse_array<int,unsigned_long> *)__p,first_index,last_index,first_value,last_value);
  std::
  unique_ptr<pstore::sparse_array<int,unsigned_long>,std::default_delete<pstore::sparse_array<int,unsigned_long>>>
  ::unique_ptr<std::default_delete<pstore::sparse_array<int,unsigned_long>>,void>
            ((unique_ptr<pstore::sparse_array<int,unsigned_long>,std::default_delete<pstore::sparse_array<int,unsigned_long>>>
              *)this,__p);
  return (__uniq_ptr_data<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>,_true,_true>
          )(__uniq_ptr_data<pstore::sparse_array<int,_unsigned_long>,_std::default_delete<pstore::sparse_array<int,_unsigned_long>_>,_true,_true>
            )this;
}

Assistant:

auto sparse_array<ValueType, BitmapType>::make_unique (IteratorIdx first_index,
                                                           IteratorIdx last_index,
                                                           IteratorV first_value,
                                                           IteratorV last_value)
        -> std::unique_ptr<sparse_array> {

        return std::unique_ptr<sparse_array<ValueType, BitmapType>>{
            new (first_index, last_index) sparse_array<ValueType, BitmapType> (
                first_index, last_index, first_value, last_value)};
    }